

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
read_file_text(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
              string *file_name)

{
  pointer pcVar1;
  iterator __position;
  int iVar2;
  FILE *__stream;
  uint32_t num;
  uint local_44;
  string local_40;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar1 = (file_name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + file_name->_M_string_length);
  __stream = (FILE *)fopen_or_fail(&local_40,"r");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  while( true ) {
    iVar2 = __isoc99_fscanf(__stream,"%u\n",&local_44);
    if (iVar2 != 1) break;
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                 __position,&local_44);
    }
    else {
      *__position._M_current = local_44;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  iVar2 = fclose(__stream);
  if (iVar2 == 0) {
    return __return_storage_ptr__;
  }
  quit("closing file failed");
}

Assistant:

std::vector<uint32_t> read_file_text(std::string file_name)
{
    std::vector<uint32_t> content;
    auto fd = fopen_or_fail(file_name, "r");
    uint32_t num;
    while (fscanf(fd, "%u\n", &num) == 1) {
        content.push_back(num);
    }
    fclose_or_fail(fd);
    return content;
}